

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsNodeQueue.cpp
# Opt level: O2

void __thiscall HighsNodeQueue::unlink_domchgs(HighsNodeQueue *this,int64_t node)

{
  int iVar1;
  pointer pOVar2;
  pointer pHVar3;
  long lVar4;
  long lVar5;
  pointer p_Var6;
  NodeSetArray *pNVar7;
  ulong uVar8;
  
  pOVar2 = (this->nodes).
           super__Vector_base<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pHVar3 = *(pointer *)
            ((long)&pOVar2[node].domchgstack.
                    super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
                    _M_impl + 8);
  lVar4 = *(long *)&pOVar2[node].domchgstack.
                    super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
                    _M_impl;
  for (uVar8 = 0;
      pOVar2 = (this->nodes).
               super__Vector_base<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_>
               ._M_impl.super__Vector_impl_data._M_start,
      ((ulong)((long)pHVar3 - lVar4) >> 1 & 0x7fffffff8) != uVar8; uVar8 = uVar8 + 8) {
    lVar5 = *(long *)&pOVar2[node].domchgstack.
                      super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
                      _M_impl;
    iVar1 = *(int *)(lVar5 + 0xc + uVar8 * 2);
    pNVar7 = &this->colLowerNodesPtr;
    if ((iVar1 == 0) || (pNVar7 = &this->colUpperNodesPtr, iVar1 == 1)) {
      std::
      _Rb_tree<std::pair<double,long>,std::pair<double,long>,std::_Identity<std::pair<double,long>>,std::less<std::pair<double,long>>,HighsNodeQueue::NodesetAllocator<std::pair<double,long>>>
      ::erase_abi_cxx11_((_Rb_tree<std::pair<double,long>,std::pair<double,long>,std::_Identity<std::pair<double,long>>,std::less<std::pair<double,long>>,HighsNodeQueue::NodesetAllocator<std::pair<double,long>>>
                          *)((pNVar7->_M_t).
                             super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                             .
                             super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                             ._M_head_impl + *(int *)(lVar5 + 8 + uVar8 * 2)),
                         *(_Base_ptr *)
                          (*(long *)&pOVar2[node].domchglinks.
                                     super__Vector_base<std::_Rb_tree_const_iterator<std::pair<double,_long>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<double,_long>_>_>_>
                                     ._M_impl.super__Vector_impl_data + uVar8));
    }
  }
  p_Var6 = pOVar2[node].domchglinks.
           super__Vector_base<std::_Rb_tree_const_iterator<std::pair<double,_long>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<double,_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (*(pointer *)
       ((long)&pOVar2[node].domchglinks.
               super__Vector_base<std::_Rb_tree_const_iterator<std::pair<double,_long>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<double,_long>_>_>_>
               ._M_impl + 8) != p_Var6) {
    *(pointer *)
     ((long)&pOVar2[node].domchglinks.
             super__Vector_base<std::_Rb_tree_const_iterator<std::pair<double,_long>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<double,_long>_>_>_>
             ._M_impl + 8) = p_Var6;
  }
  std::
  vector<std::_Rb_tree_const_iterator<std::pair<double,_long>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<double,_long>_>_>_>
  ::_M_shrink_to_fit(&pOVar2[node].domchglinks);
  return;
}

Assistant:

void HighsNodeQueue::unlink_domchgs(int64_t node) {
  assert(node != -1);
  HighsInt numchgs = nodes[node].domchgstack.size();

  for (HighsInt i = 0; i != numchgs; ++i) {
    HighsInt col = nodes[node].domchgstack[i].column;
    switch (nodes[node].domchgstack[i].boundtype) {
      case HighsBoundType::kLower:
        colLowerNodesPtr.get()[col].erase(nodes[node].domchglinks[i]);
        break;
      case HighsBoundType::kUpper:
        colUpperNodesPtr.get()[col].erase(nodes[node].domchglinks[i]);
    }
  }

  nodes[node].domchglinks.clear();
  nodes[node].domchglinks.shrink_to_fit();
}